

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Instance_Iterator::Next(Am_Instance_Iterator *this)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object_Data *pAVar3;
  Am_Object_Data *proto_data;
  Am_Object_Data *curr_data;
  Am_Instance_Iterator *this_local;
  
  bVar1 = Am_Object::Valid(&this->current);
  if (bVar1) {
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&this->current);
    pAVar3 = Am_Object_Data::Narrow(pAVar2);
    if (pAVar3->next_instance != (Am_Object_Data *)0x0) {
      Am_Wrapper::Note_Reference(&pAVar3->next_instance->super_Am_Wrapper);
    }
    Am_Object::operator=(&this->current,pAVar3->next_instance);
    Am_Wrapper::Release(&pAVar3->super_Am_Wrapper);
  }
  else {
    bVar1 = Am_Object::Valid(&this->prototype);
    if (bVar1) {
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&this->prototype);
      pAVar3 = Am_Object_Data::Narrow(pAVar2);
      if (pAVar3->first_instance != (Am_Object_Data *)0x0) {
        Am_Wrapper::Note_Reference(&pAVar3->first_instance->super_Am_Wrapper);
      }
      Am_Object::operator=(&this->current,pAVar3->first_instance);
      Am_Wrapper::Release(&pAVar3->super_Am_Wrapper);
    }
  }
  return;
}

Assistant:

void
Am_Instance_Iterator::Next()
{
  if (current.Valid()) {
    Am_Object_Data *curr_data = Am_Object_Data::Narrow(current);
    if (curr_data->next_instance)
      curr_data->next_instance->Note_Reference();
    current = curr_data->next_instance;
    curr_data->Release();
  } else if (prototype.Valid()) {
    Am_Object_Data *proto_data = Am_Object_Data::Narrow(prototype);
    if (proto_data->first_instance)
      proto_data->first_instance->Note_Reference();
    current = proto_data->first_instance;
    proto_data->Release();
  }
}